

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O1

bool __thiscall draco::PointCloudEncoder::EncodePointAttributes(PointCloudEncoder *this)

{
  EncoderBuffer *pEVar1;
  pointer puVar2;
  AttributesEncoder *pAVar3;
  uint *puVar4;
  int *piVar5;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var6;
  char cVar7;
  int iVar8;
  undefined8 in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  pointer puVar9;
  uint *puVar10;
  int *piVar11;
  bool bVar12;
  
  iVar8 = (*this->_vptr_PointCloudEncoder[8])();
  if ((char)iVar8 != '\0') {
    pEVar1 = this->buffer_;
    if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar1,
                 (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&stack0xffffffffffffffdf,&stack0xffffffffffffffe0
                 ,in_R8,in_R9,
                 CONCAT17((char)((uint)(*(int *)&(this->attributes_encoders_).
                                                 super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                       *(int *)&(this->attributes_encoders_).
                                                super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          (int7)in_RAX));
    }
    puVar9 = (this->attributes_encoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->attributes_encoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar12 = puVar9 == puVar2;
    if (!bVar12) {
      pAVar3 = (puVar9->_M_t).
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
      iVar8 = (*pAVar3->_vptr_AttributesEncoder[2])(pAVar3,this,this->point_cloud_);
      cVar7 = (char)iVar8;
      while (cVar7 != '\0') {
        puVar9 = puVar9 + 1;
        bVar12 = puVar9 == puVar2;
        if (bVar12) goto LAB_0014703a;
        pAVar3 = (puVar9->_M_t).
                 super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                 .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
        iVar8 = (*pAVar3->_vptr_AttributesEncoder[2])(pAVar3,this,this->point_cloud_);
        cVar7 = (char)iVar8;
      }
      if (!bVar12) {
        return (bool)0;
      }
    }
LAB_0014703a:
    bVar12 = RearrangeAttributesEncoders(this);
    if (bVar12) {
      puVar10 = (uint *)(this->attributes_encoder_ids_order_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar4 = (uint *)(this->attributes_encoder_ids_order_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
      bVar12 = puVar10 == puVar4;
      if (!bVar12) {
        iVar8 = (*this->_vptr_PointCloudEncoder[10])(this,(ulong)*puVar10);
        cVar7 = (char)iVar8;
        while (cVar7 != '\0') {
          puVar10 = puVar10 + 1;
          bVar12 = puVar10 == puVar4;
          if (bVar12) goto LAB_00147091;
          iVar8 = (*this->_vptr_PointCloudEncoder[10])(this,(ulong)*puVar10);
          cVar7 = (char)iVar8;
        }
        if (!bVar12) {
          return (bool)0;
        }
      }
LAB_00147091:
      piVar11 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar5 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar12 = piVar11 == piVar5;
      if (!bVar12) {
        _Var6._M_t.
        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
             (this->attributes_encoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar11]._M_t.
             super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
             ._M_t;
        cVar7 = (**(code **)(*(long *)_Var6._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                      .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                      _M_head_impl + 0x18))
                          (_Var6._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                           .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
                           this->buffer_);
        while (cVar7 != '\0') {
          piVar11 = piVar11 + 1;
          bVar12 = piVar11 == piVar5;
          if (bVar12) goto LAB_001470ea;
          _Var6._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
               (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar11]._M_t.
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t;
          cVar7 = (**(code **)(*(long *)_Var6._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                        _M_head_impl + 0x18))
                            (_Var6._M_t.
                             super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                             .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
                             this->buffer_);
        }
        if (!bVar12) {
          return (bool)0;
        }
      }
LAB_001470ea:
      iVar8 = (*this->_vptr_PointCloudEncoder[0xb])(this);
      return (bool)(char)iVar8;
    }
  }
  return false;
}

Assistant:

bool PointCloudEncoder::EncodePointAttributes() {
  if (!GenerateAttributesEncoders()) {
    return false;
  }

  // Encode the number of attribute encoders.
  buffer_->Encode(static_cast<uint8_t>(attributes_encoders_.size()));

  // Initialize all the encoders (this is used for example to init attribute
  // dependencies, no data is encoded in this step).
  for (auto &att_enc : attributes_encoders_) {
    if (!att_enc->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Rearrange attributes to respect dependencies between individual attributes.
  if (!RearrangeAttributesEncoders()) {
    return false;
  }

  // Encode any data that is necessary to create the corresponding attribute
  // decoder.
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!EncodeAttributesEncoderIdentifier(att_encoder_id)) {
      return false;
    }
  }

  // Also encode any attribute encoder data (such as the info about encoded
  // attributes).
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributesEncoderData(
            buffer_)) {
      return false;
    }
  }

  // Lastly encode all the attributes using the provided attribute encoders.
  if (!EncodeAllAttributes()) {
    return false;
  }
  return true;
}